

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_fsa.c
# Opt level: O3

void soa_fsa_init(soa_fsa_t *allocator,size_t blockSize,uchar numBlocks)

{
  allocator->blockSize = blockSize;
  allocator->numBlocks = numBlocks;
  allocator->chunks = (soa_chunk_t *)0x0;
  allocator->allocChunk = (soa_chunk_t *)0x0;
  allocator->deallocChunk = (soa_chunk_t *)0x0;
  allocator->chunks_len = 0;
  return;
}

Assistant:

void soa_fsa_init( soa_fsa_t *allocator,size_t blockSize, unsigned char numBlocks )
{  
  allocator->blockSize = blockSize;
  allocator->numBlocks = numBlocks;
  allocator->allocChunk = 0;
  allocator->deallocChunk = 0;
  allocator->chunks_len = 0;
  allocator->chunks = 0;
}